

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

int __thiscall
btHashMap<btHashString,_btCollisionShape_*>::findIndex
          (btHashMap<btHashString,_btCollisionShape_*> *this,btHashString *key)

{
  int iVar1;
  char *dst;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (long)(this->m_valueArray).m_capacity - 1U & (long)(int)key->m_hash;
  if ((uint)uVar3 < (uint)(this->m_hashTable).m_size) {
    for (iVar1 = (this->m_hashTable).m_data[uVar3]; iVar1 != -1;
        iVar1 = (this->m_next).m_data[iVar1]) {
      dst = (this->m_keyArray).m_data[iVar1].m_string;
      if (key->m_string == dst) {
        return iVar1;
      }
      iVar2 = btHashString::portableStringCompare(key,key->m_string,dst);
      if (iVar2 == 0) {
        return iVar1;
      }
    }
  }
  return -1;
}

Assistant:

SIMD_FORCE_INLINE	unsigned int getHash()const
	{
		return m_hash;
	}